

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::setString
          (Message *this,string *string,bool doValidation,DataDictionary *pSessionDataDictionary,
          DataDictionary *pApplicationDataDictionary)

{
  bool bVar1;
  ulong uVar2;
  InvalidMessage *this_00;
  undefined7 in_register_00000011;
  int iVar3;
  int iVar4;
  allocator<char> local_152;
  char local_151;
  DataDictionary *local_150;
  size_type pos;
  undefined4 local_13c;
  FieldMap *local_138;
  FieldMap *local_130;
  Fields *local_128;
  Fields *local_120;
  Fields *local_118;
  string local_110;
  FieldBase field;
  MsgType msg;
  
  local_150 = pApplicationDataDictionary;
  clear(this);
  pos = 0;
  MsgType::MsgType(&msg);
  local_120 = &(this->super_FieldMap).m_fields;
  local_138 = &(this->m_trailer).super_FieldMap;
  local_128 = &(this->m_trailer).super_FieldMap.m_fields;
  local_130 = &(this->m_header).super_FieldMap;
  local_118 = &(this->m_header).super_FieldMap.m_fields;
  local_13c = (undefined4)CONCAT71(in_register_00000011,doValidation);
  local_151 = !doValidation;
  iVar3 = 0;
  iVar4 = 0;
  uVar2 = 0;
  do {
    if (string->_M_string_length <= uVar2) {
      FieldMap::sortFields(local_130);
      FieldMap::sortFields(&this->super_FieldMap);
      FieldMap::sortFields(local_138);
      if ((char)local_13c != '\0') {
        validate(this);
      }
      FieldBase::~FieldBase((FieldBase *)&msg);
      return;
    }
    extractField(&field,this,string,&pos,pSessionDataDictionary,local_150,(Group *)0x0);
    if (iVar3 < 3) {
      if ((&headerOrder)[iVar3] != field.m_tag && local_151 == '\0') {
        this_00 = (InvalidMessage *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Header fields out of order",&local_152);
        InvalidMessage::InvalidMessage(this_00,&local_110);
        __cxa_throw(this_00,&InvalidMessage::typeinfo,Exception::~Exception);
      }
      iVar3 = iVar3 + 1;
    }
    bVar1 = isHeaderField(field.m_tag,pSessionDataDictionary);
    if (bVar1) {
      if (iVar4 != 0) {
        if (this->m_tag == 0) {
          this->m_tag = field.m_tag;
        }
        this->m_validStructure = false;
      }
      if (field.m_tag == 0x23) {
        FieldBase::setString((FieldBase *)&msg,&field.m_string);
        bVar1 = isAdminMsgType(&msg);
        if (bVar1) {
          local_150 = pSessionDataDictionary;
        }
      }
      std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back(local_118,&field);
      if (pSessionDataDictionary != (DataDictionary *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"_header_",&local_152);
        setGroup(this,&local_110,&field,string,&pos,local_130,pSessionDataDictionary);
        std::__cxx11::string::~string((string *)&local_110);
      }
    }
    else {
      bVar1 = isTrailerField(field.m_tag,pSessionDataDictionary);
      if (bVar1) {
        std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back(local_128,&field);
        if (pSessionDataDictionary != (DataDictionary *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,"_trailer_",&local_152);
          setGroup(this,&local_110,&field,string,&pos,local_138,pSessionDataDictionary);
          std::__cxx11::string::~string((string *)&local_110);
        }
        iVar4 = 2;
      }
      else {
        if (iVar4 == 2) {
          if (this->m_tag == 0) {
            this->m_tag = field.m_tag;
          }
          this->m_validStructure = false;
        }
        std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back(local_120,&field);
        if (local_150 == (DataDictionary *)0x0) {
          local_150 = (DataDictionary *)0x0;
          iVar4 = 1;
        }
        else {
          setGroup(this,&msg.super_StringField.super_FieldBase.m_string,&field,string,&pos,
                   &this->super_FieldMap,local_150);
          iVar4 = 1;
        }
      }
    }
    FieldBase::~FieldBase(&field);
    uVar2 = pos;
  } while( true );
}

Assistant:

void Message::setString( const std::string& string,
                         bool doValidation,
                         const DataDictionary* pSessionDataDictionary,
                         const DataDictionary* pApplicationDataDictionary )
EXCEPT ( InvalidMessage )
{
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  FIX::MsgType msg;

  field_type type = header;

  while ( pos < string.size() )
  {
    FieldBase field = extractField( string, pos, pSessionDataDictionary, pApplicationDataDictionary );
    if ( count < 3 && headerOrder[ count++ ] != field.getTag() )
      if ( doValidation ) throw InvalidMessage("Header fields out of order");

    if ( isHeaderField( field, pSessionDataDictionary ) )
    {
      if ( type != header )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      if ( field.getTag() == FIELD::MsgType )
      {
        msg.setString( field.getString() );
        if ( isAdminMsgType( msg ) )
        {
          pApplicationDataDictionary = pSessionDataDictionary;
#ifdef HAVE_EMX
          m_subMsgType.assign(msg);
        }
        else
        {
          std::string::size_type equalSign = string.find("\0019426=", pos);
          if (equalSign == std::string::npos)
            throw InvalidMessage("EMX message type (9426) not found");

          equalSign += 6;
          std::string::size_type soh = string.find_first_of('\001', equalSign);
          if (soh == std::string::npos)
            throw InvalidMessage("EMX message type (9426) soh char not found");
          m_subMsgType.assign(string.substr(equalSign, soh - equalSign ));
#endif
        }
      }

      m_header.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_header_", field, string, pos, getHeader(), *pSessionDataDictionary );
    }
    else if ( isTrailerField( field, pSessionDataDictionary ) )
    {
      type = trailer;
      m_trailer.appendField( field );

      if ( pSessionDataDictionary )
        setGroup( "_trailer_", field, string, pos, getTrailer(), *pSessionDataDictionary );
    }
    else
    {
      if ( type == trailer )
      {
        if(m_tag == 0) m_tag = field.getTag();
        m_validStructure = false;
      }

      type = body;
      appendField( field );

      if ( pApplicationDataDictionary )
#ifdef HAVE_EMX
        setGroup(m_subMsgType, field, string, pos, *this, *pApplicationDataDictionary);
#else
        setGroup( msg, field, string, pos, *this, *pApplicationDataDictionary );
#endif
    }
  }

  // sort fields
  m_header.sortFields();
  sortFields();
  m_trailer.sortFields();

  if ( doValidation )
    validate();
}